

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string *
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,xpath_node *na,xpath_allocator *alloc)

{
  char *pcVar1;
  uint uVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xpath_string local_48;
  
  pxVar4 = (xml_node_struct *)(na->_attribute)._attr;
  if (pxVar4 == (xml_node_struct *)0x0) {
    pxVar4 = (na->_node)._root;
    if (pxVar4 == (xml_node_struct *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)pxVar4->header & 0xf;
    }
    pcVar1 = "";
    if (3 < uVar2 - 3) {
      if (uVar2 - 1 < 2) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        pcVar1 = "";
        if (pxVar4 != (xml_node_struct *)0x0) {
          pcVar1 = "";
          if (pxVar4->value != (char *)0x0) {
            pcVar1 = pxVar4->value;
          }
        }
        if (*pcVar1 != '\0') {
          if (pxVar4 == (xml_node_struct *)0x0) {
            local_48._buffer = (char_t *)(xml_node_struct *)0x1a7777;
          }
          else {
            local_48._buffer = (char_t *)(xml_node_struct *)0x1a7777;
            if ((xml_node_struct *)pxVar4->value != (xml_node_struct *)0x0) {
              local_48._buffer = pxVar4->value;
            }
          }
          local_48._uses_heap = false;
          local_48._length_heap = 0;
          xpath_string::append(__return_storage_ptr__,&local_48,alloc);
        }
        if (pxVar4 == (xml_node_struct *)0x0) {
          xml_node::xml_node((xml_node *)&local_48);
        }
        else {
          xml_node::xml_node((xml_node *)&local_48,pxVar4->first_child);
        }
        pxVar3 = (xml_node_struct *)local_48._buffer;
        if ((xml_node_struct *)local_48._buffer == pxVar4 ||
            (xml_node_struct *)local_48._buffer == (xml_node_struct *)0x0) {
          return __return_storage_ptr__;
        }
        do {
          if (((pxVar3->header & 0xf) == 3) || ((pxVar3->header & 0xf) == 4)) {
            local_48._buffer = pxVar3->value;
            if ((xml_node_struct *)local_48._buffer == (xml_node_struct *)0x0) {
              local_48._buffer = "";
            }
            local_48._uses_heap = false;
            local_48._length_heap = 0;
            xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          }
          xml_node::xml_node((xml_node *)&local_48,pxVar3->first_child);
          if ((xml_node_struct *)local_48._buffer == (xml_node_struct *)0x0) {
            xml_node::xml_node((xml_node *)&local_48,pxVar3->next_sibling);
            if ((xml_node_struct *)local_48._buffer != (xml_node_struct *)0x0) {
LAB_0018db40:
              pxVar3 = pxVar3->next_sibling;
              goto LAB_0018db44;
            }
            while( true ) {
              if (pxVar3 == (xml_node_struct *)0x0) {
                xml_node::xml_node((xml_node *)&local_48);
              }
              else {
                xml_node::xml_node((xml_node *)&local_48,pxVar3->next_sibling);
              }
              if ((pxVar3 == pxVar4) ||
                 ((xml_node_struct *)local_48._buffer != (xml_node_struct *)0x0)) break;
              if (pxVar3 == (xml_node_struct *)0x0) {
                xml_node::xml_node((xml_node *)&local_48);
                pxVar3 = (xml_node_struct *)local_48._buffer;
              }
              else {
                xml_node::xml_node((xml_node *)&local_48,pxVar3->parent);
                pxVar3 = (xml_node_struct *)local_48._buffer;
              }
            }
            if (pxVar3 != pxVar4) {
              if (pxVar3 != (xml_node_struct *)0x0) goto LAB_0018db40;
              xml_node::xml_node((xml_node *)&local_48);
              pxVar3 = (xml_node_struct *)local_48._buffer;
            }
          }
          else {
            pxVar3 = pxVar3->first_child;
LAB_0018db44:
            xml_node::xml_node((xml_node *)&local_48,pxVar3);
            pxVar3 = (xml_node_struct *)local_48._buffer;
          }
          if (pxVar3 == (xml_node_struct *)0x0) {
            return __return_storage_ptr__;
          }
          if (pxVar3 == pxVar4) {
            return __return_storage_ptr__;
          }
        } while( true );
      }
      goto LAB_0018d9d0;
    }
    if (pxVar4 == (xml_node_struct *)0x0) goto LAB_0018d9d0;
  }
  pcVar1 = "";
  if (pxVar4->value != (char *)0x0) {
    pcVar1 = pxVar4->value;
  }
LAB_0018d9d0:
  __return_storage_ptr__->_buffer = pcVar1;
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}